

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileOptions::InternalSwap(FileOptions *this,FileOptions *other)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  void *pvVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  void *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  psVar4 = (this->java_package_).ptr_;
  (this->java_package_).ptr_ = (other->java_package_).ptr_;
  (other->java_package_).ptr_ = psVar4;
  psVar4 = (this->java_outer_classname_).ptr_;
  (this->java_outer_classname_).ptr_ = (other->java_outer_classname_).ptr_;
  (other->java_outer_classname_).ptr_ = psVar4;
  psVar4 = (this->go_package_).ptr_;
  (this->go_package_).ptr_ = (other->go_package_).ptr_;
  (other->go_package_).ptr_ = psVar4;
  psVar4 = (this->objc_class_prefix_).ptr_;
  (this->objc_class_prefix_).ptr_ = (other->objc_class_prefix_).ptr_;
  (other->objc_class_prefix_).ptr_ = psVar4;
  psVar4 = (this->csharp_namespace_).ptr_;
  (this->csharp_namespace_).ptr_ = (other->csharp_namespace_).ptr_;
  (other->csharp_namespace_).ptr_ = psVar4;
  psVar4 = (this->swift_prefix_).ptr_;
  (this->swift_prefix_).ptr_ = (other->swift_prefix_).ptr_;
  (other->swift_prefix_).ptr_ = psVar4;
  psVar4 = (this->php_class_prefix_).ptr_;
  (this->php_class_prefix_).ptr_ = (other->php_class_prefix_).ptr_;
  (other->php_class_prefix_).ptr_ = psVar4;
  bVar1 = this->java_multiple_files_;
  this->java_multiple_files_ = other->java_multiple_files_;
  other->java_multiple_files_ = bVar1;
  bVar1 = this->java_generate_equals_and_hash_;
  this->java_generate_equals_and_hash_ = other->java_generate_equals_and_hash_;
  other->java_generate_equals_and_hash_ = bVar1;
  bVar1 = this->java_string_check_utf8_;
  this->java_string_check_utf8_ = other->java_string_check_utf8_;
  other->java_string_check_utf8_ = bVar1;
  bVar1 = this->cc_generic_services_;
  this->cc_generic_services_ = other->cc_generic_services_;
  other->cc_generic_services_ = bVar1;
  bVar1 = this->java_generic_services_;
  this->java_generic_services_ = other->java_generic_services_;
  other->java_generic_services_ = bVar1;
  bVar1 = this->py_generic_services_;
  this->py_generic_services_ = other->py_generic_services_;
  other->py_generic_services_ = bVar1;
  bVar1 = this->deprecated_;
  this->deprecated_ = other->deprecated_;
  other->deprecated_ = bVar1;
  bVar1 = this->cc_enable_arenas_;
  this->cc_enable_arenas_ = other->cc_enable_arenas_;
  other->cc_enable_arenas_ = bVar1;
  iVar2 = this->optimize_for_;
  this->optimize_for_ = other->optimize_for_;
  other->optimize_for_ = iVar2;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar7 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar7 & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_00595cad;
LAB_00595c95:
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_00595c95;
    pUVar9 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar7 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar7 & 1) == 0) {
    pUVar8 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe);
  }
  pvVar6 = pUVar8->fields_;
  pUVar8->fields_ = pUVar9->fields_;
  pUVar9->fields_ = pvVar6;
LAB_00595cad:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  return;
}

Assistant:

void FileOptions::InternalSwap(FileOptions* other) {
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  java_package_.Swap(&other->java_package_);
  java_outer_classname_.Swap(&other->java_outer_classname_);
  go_package_.Swap(&other->go_package_);
  objc_class_prefix_.Swap(&other->objc_class_prefix_);
  csharp_namespace_.Swap(&other->csharp_namespace_);
  swift_prefix_.Swap(&other->swift_prefix_);
  php_class_prefix_.Swap(&other->php_class_prefix_);
  std::swap(java_multiple_files_, other->java_multiple_files_);
  std::swap(java_generate_equals_and_hash_, other->java_generate_equals_and_hash_);
  std::swap(java_string_check_utf8_, other->java_string_check_utf8_);
  std::swap(cc_generic_services_, other->cc_generic_services_);
  std::swap(java_generic_services_, other->java_generic_services_);
  std::swap(py_generic_services_, other->py_generic_services_);
  std::swap(deprecated_, other->deprecated_);
  std::swap(cc_enable_arenas_, other->cc_enable_arenas_);
  std::swap(optimize_for_, other->optimize_for_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
  _extensions_.Swap(&other->_extensions_);
}